

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  uint Entry;
  
  uVar1 = *(ulong *)pObj;
  if ((uVar1 & 0xc0000000) != 0 || (~(uint)uVar1 & 0x1fffffff) == 0) {
    return;
  }
  *(ulong *)pObj = uVar1 | 0x40000000;
  Gia_ObjCollectInternal_rec(p,pObj + -(uVar1 & 0x1fffffff));
  Gia_ObjCollectInternal_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    Entry = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    if (((int)Entry < 0) || (p->vTtNums->nSize <= (int)Entry)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p_00 = p->vTtNodes;
    p->vTtNums->pArray[Entry & 0x7fffffff] = p_00->nSize;
    if (pObj < pGVar2 + p->nObjs) {
      Vec_IntPush(p_00,Entry);
      return;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin1(pObj) );
    Gia_ObjSetNum( p, pObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, Gia_ObjId(p, pObj) );
}